

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedDatum.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::FixedDatum::Decode(FixedDatum *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KUINT16 i;
  long lVar2;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (7 < KVar1) {
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32DatumID);
    lVar2 = 0;
    do {
      KDataStream::Read(stream,this->m_cDatumValue + lVar2);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void FixedDatum::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < FixedDatum::FIXED_DATUM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32DatumID;

    for( KUINT16 i = 0; i < 4; ++i )
    {
        stream >> m_cDatumValue[i];
    }
}